

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O3

void __thiscall SAT::addClause(SAT *this,Clause *c,bool one_watch)

{
  int *piVar1;
  char cVar2;
  Lit p;
  int *piVar3;
  char cVar4;
  uint uVar5;
  ostream *poVar6;
  mapped_type *this_00;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  long lVar10;
  set<int,_std::less<int>,_std::allocator<int>_> levels;
  stringstream s;
  string local_208;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e8;
  anon_union_8_2_743a5d44_for_WatchElem_0 local_1b8 [2];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar5 = *(uint *)c >> 8;
  if (uVar5 == 1) {
    p.x = c->data[0].x;
    cVar2 = (this->assigns).data[(uint)(p.x >> 1)];
    cVar4 = -cVar2;
    if ((p.x & 1U) == 0) {
      cVar4 = cVar2;
    }
    if (cVar4 != ::l_False.value) {
      if (cVar4 == ::l_Undef.value) {
        enqueue(this,p,(Reason)0x0);
      }
      free(c);
      return;
    }
    puts("=====UNSATISFIABLE=====");
    printf("%% Top level failure!\n");
    exit(0);
  }
  if ((*(uint *)c & 1) == 0) {
    if (uVar5 == 3) {
      this->tern_clauses = this->tern_clauses + 1;
    }
    else if (uVar5 == 2) {
      this->bin_clauses = this->bin_clauses + 1;
    }
    else {
      this->long_clauses = this->long_clauses + 1;
    }
  }
  uVar5 = *(uint *)c;
  if (0xff < uVar5 && (uVar5 & 1) != 0) {
    piVar3 = (this->num_used).data;
    uVar7 = 0;
    do {
      uVar9 = (c->data[uVar7].x >> 1) - this->orig_cutoff;
      if (-1 < (int)uVar9) {
        piVar1 = piVar3 + uVar9;
        *piVar1 = *piVar1 + 1;
        uVar5 = *(uint *)c;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar5 >> 8);
  }
  if ((uVar5 & 0xffffff00) == 0x200) {
    if (((uVar5 & 1) == 0) || (so.bin_clause_opt == true)) {
      if (!one_watch) {
        local_1b8[0]._pt = (Clause *)(((ulong)*(uint *)(c + 1) << 0x20) + 1);
        vec<WatchElem>::push
                  ((this->watches).data + ((ulong)(uint)c->data[0].x ^ 1),(WatchElem *)local_1b8);
        if (*(uint *)c < 0x200) goto LAB_001bedf4;
      }
      local_1b8[0]._pt = (Clause *)(((ulong)(uint)c->data[0].x << 0x20) + 1);
      vec<WatchElem>::push
                ((this->watches).data + ((ulong)*(uint *)(c + 1) ^ 1),(WatchElem *)local_1b8);
      if (((ulong)*c & 1) != 0) {
        return;
      }
      free(c);
      return;
    }
    if (one_watch) goto LAB_001beba1;
LAB_001beb78:
    local_1b8[0]._pt = c;
    vec<WatchElem>::push
              ((this->watches).data + ((ulong)(uint)c->data[0].x ^ 1),(WatchElem *)local_1b8);
    uVar5 = *(uint *)c;
  }
  else if (!one_watch) {
    if (uVar5 < 0x100) goto LAB_001bedf4;
    goto LAB_001beb78;
  }
  if (0x1ff < uVar5) {
LAB_001beba1:
    local_1b8[0]._pt = c;
    vec<WatchElem>::push
              ((this->watches).data + ((ulong)*(uint *)(c + 1) ^ 1),(WatchElem *)local_1b8);
    (&this->clauses_literals)[*(uint *)c & 1] =
         (&this->clauses_literals)[*(uint *)c & 1] + (ulong)(*(uint *)c >> 8);
    if (((ulong)*c & 1) == 0) {
      local_1b8[0]._pt = c;
      vec<Clause_*>::push(&this->clauses,&local_1b8[0]._pt);
    }
    else {
      local_1b8[0]._pt = c;
      vec<Clause_*>::push(&this->learnts,&local_1b8[0]._pt);
      if (so.learnt_stats == true) {
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1e8._M_impl.super__Rb_tree_header._M_header;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1e8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1e8._M_impl.super__Rb_tree_header._M_header._M_left;
        if (0xff < *(uint *)c) {
          lVar10 = 0;
          uVar7 = 0;
          do {
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_1e8,(int *)((long)(this->out_learnt_level).data + lVar10));
            uVar7 = uVar7 + 1;
            lVar10 = lVar10 + 4;
          } while (uVar7 < *(uint *)c >> 8);
        }
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        poVar6 = (ostream *)std::ostream::operator<<(local_1a8,c[1].data[*(uint *)c >> 8].x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        if ((so.learnt_stats_nogood == true) &&
           (std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",",1),
           0xff < *(uint *)c)) {
          uVar7 = 0;
          do {
            pcVar8 = "";
            if (uVar7 != 0) {
              pcVar8 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,pcVar8,(ulong)(uVar7 != 0));
            if (*(uint *)c >> 8 <= uVar7) goto LAB_001bedf4;
            getLitString_abi_cxx11_(&local_208,c->data[uVar7].x);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208._M_dataplus._M_p != &local_208.field_2) {
              operator_delete(local_208._M_dataplus._M_p);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 < *(uint *)c >> 8);
        }
        std::__cxx11::stringbuf::str();
        this_00 = std::
                  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&learntClauseString_abi_cxx11_,&c[1].data[*(uint *)c >> 8].x);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree(&local_1e8);
      }
    }
    return;
  }
LAB_001bedf4:
  abort();
}

Assistant:

void SAT::addClause(Clause& c, bool one_watch) {
	assert(c.size() > 0);
	if (c.size() == 1) {
		assert(decisionLevel() == 0);
		if (DEBUG) {
			fprintf(stderr, "warning: adding length 1 clause!\n");
		}
		if (value(c[0]) == l_False) {
			TL_FAIL();
		}
		if (value(c[0]) == l_Undef) {
			enqueue(c[0]);
		}
		free(&c);
		return;
	}
	if (!c.learnt) {
		if (c.size() == 2) {
			bin_clauses++;
		} else if (c.size() == 3) {
			tern_clauses++;
		} else {
			long_clauses++;
		}
	}

	// Mark lazy lits which are used
	if (c.learnt) {
		for (unsigned int i = 0; i < c.size(); i++) {
			incVarUse(var(c[i]));
		}
	}

	if (c.size() == 2 && ((!c.learnt) || (so.bin_clause_opt))) {
		if (!one_watch) {
			watches[toInt(~c[0])].push(c[1]);
		}
		watches[toInt(~c[1])].push(c[0]);
		if (!c.learnt) {
			free(&c);
		}
		return;
	}
	if (!one_watch) {
		watches[toInt(~c[0])].push(&c);
	}
	watches[toInt(~c[1])].push(&c);
	if (c.learnt) {
		learnts_literals += c.size();
	} else {
		clauses_literals += c.size();
	}
	if (c.learnt) {
		learnts.push(&c);
		if (so.learnt_stats) {
			std::set<int> levels;
			for (unsigned int i = 0; i < c.size(); i++) {
				levels.insert(out_learnt_level[i]);
			}
			std::stringstream s;
			//            s << "learntclause,";
			s << c.clauseID() << "," << c.size() << "," << levels.size();
			if (so.learnt_stats_nogood) {
				s << ",";
				for (unsigned int i = 0; i < c.size(); i++) {
					s << (i == 0 ? "" : " ") << getLitString(toInt(c[i]));
					//              s << " (" << out_learnt_level[i] << ")";
				}
			}
			// std::cerr << "\n";
			learntClauseString[c.clauseID()] = s.str();
		}
	} else {
		clauses.push(&c);
	}
}